

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TextureCubeMapArrayGenerateMipMapNonFilterable::iterate
          (TextureCubeMapArrayGenerateMipMapNonFilterable *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  TestLog *this_00;
  MessageBuilder *pMVar7;
  TestError *this_01;
  MessageBuilder local_1a0;
  int local_20;
  uint local_1c;
  int error_code;
  uint n_storage_config;
  Functions *gl;
  TextureCubeMapArrayGenerateMipMapNonFilterable *this_local;
  
  gl = (Functions *)this;
  initTest(this);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  _error_code = CONCAT44(extraout_var,iVar2);
  local_1c = 0;
  while( true ) {
    uVar4 = (ulong)local_1c;
    sVar5 = std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::size
                      (&this->m_non_filterable_texture_configs);
    if (sVar5 <= uVar4) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    pcVar1 = *(code **)(_error_code + 0xb8);
    pvVar6 = std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::operator[]
                       (&this->m_non_filterable_texture_configs,(ulong)local_1c);
    (*pcVar1)(0x9009,pvVar6->m_to_id);
    err = (**(code **)(_error_code + 0x800))();
    glu::checkError(err,"glBindTexture() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                    ,0x293);
    (**(code **)(_error_code + 0x710))(0x9009);
    local_20 = (**(code **)(_error_code + 0x800))();
    if (local_20 != 0x502) break;
    local_1c = local_1c + 1;
    local_20 = 0x502;
  }
  this_00 = tcu::TestContext::getLog
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_1a0,
                      (char (*) [118])
                      "glGenerateMipmap() operating on an non-filterable internalformat did not report GL_INVALID_OPERATION as per spec but "
                     );
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_20);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [10])0x2a797de);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid error code reported for an invalid glGenerateMipmap() call.",
             (char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
             ,0x2a1);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestCase::IterateResult TextureCubeMapArrayGenerateMipMapNonFilterable::iterate()
{
	/* Initialize ES objects used by the test */
	initTest();

	/* Verify that glGenerateMipmap() always throws GL_INVALID_OPERATION, if the
	 * texture object the call would operate on uses non-filterable internalformat.
	 */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (unsigned int n_storage_config = 0; n_storage_config < m_non_filterable_texture_configs.size();
		 ++n_storage_config)
	{
		gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_non_filterable_texture_configs[n_storage_config].m_to_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		gl.generateMipmap(GL_TEXTURE_CUBE_MAP_ARRAY);

		/* What's the error code at this point? */
		int error_code = gl.getError();

		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "glGenerateMipmap() operating on an non-filterable internalformat "
								  "did not report GL_INVALID_OPERATION as per spec but "
							   << error_code << " instead." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid error code reported for an invalid glGenerateMipmap() call.");
		}
	} /* for (all storage configs) */

	/* The test has passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}